

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 google::protobuf::internal::ArenaImpl::SerialArena::Free
                 (SerialArena *serial,Block *initial_block,_func_void_void_ptr_size_t *block_dealloc
                 )

{
  Block *pBVar1;
  Block *pBVar2;
  uint64 uVar3;
  
  uVar3 = 0;
  pBVar1 = serial->head_;
  while (pBVar2 = pBVar1, pBVar2 != (Block *)0x0) {
    pBVar1 = pBVar2->next_;
    uVar3 = uVar3 + pBVar2->size_;
    if (pBVar2 != initial_block) {
      (*block_dealloc)(pBVar2,pBVar2->size_);
    }
  }
  return uVar3;
}

Assistant:

uint64 ArenaImpl::SerialArena::Free(ArenaImpl::SerialArena* serial,
                                    Block* initial_block,
                                    void (*block_dealloc)(void*, size_t)) {
  uint64 space_allocated = 0;

  // We have to be careful in this function, since we will be freeing the Block
  // that contains this SerialArena.  Be careful about accessing |serial|.

  for (Block* b = serial->head_; b;) {
    // This is inside the block we are freeing, so we need to read it now.
    Block* next_block = b->next();
    space_allocated += (b->size());

#ifdef ADDRESS_SANITIZER
    // This memory was provided by the underlying allocator as unpoisoned, so
    // return it in an unpoisoned state.
    ASAN_UNPOISON_MEMORY_REGION(b->Pointer(0), b->size());
#endif  // ADDRESS_SANITIZER

    if (b != initial_block) {
      block_dealloc(b, b->size());
    }

    b = next_block;
  }

  return space_allocated;
}